

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildDouble2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar3;
  Instr *instr;
  Func *func;
  int iVar4;
  undefined6 in_register_00000032;
  OpCode opcode;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x108);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x108);
  iVar4 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar4 < 0xbd) {
    if (iVar4 == 0x10) {
      func = this->m_func;
      opcode = Ld_A;
    }
    else {
      if (iVar4 == 0x45) {
        instr = IR::Instr::New(Ld_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
        CheckJitLoopReturn(this,dstRegSlot,TyFloat64);
        goto LAB_00501b5a;
      }
      if (iVar4 != 0x8a) goto switchD_0050197d_caseD_c5;
      func = this->m_func;
      opcode = Neg_A;
    }
  }
  else {
    switch(iVar4) {
    case 0xbd:
      func = this->m_func;
      opcode = InlineMathSin;
      break;
    case 0xbe:
      func = this->m_func;
      opcode = InlineMathCos;
      break;
    case 0xbf:
      func = this->m_func;
      opcode = InlineMathTan;
      break;
    case 0xc0:
      func = this->m_func;
      opcode = InlineMathAsin;
      break;
    case 0xc1:
      func = this->m_func;
      opcode = InlineMathAcos;
      break;
    case 0xc2:
      func = this->m_func;
      opcode = InlineMathAtan;
      break;
    case 0xc3:
      func = this->m_func;
      opcode = InlineMathAbs;
      break;
    case 0xc4:
      func = this->m_func;
      opcode = InlineMathCeil;
      break;
    case 0xc5:
    case 199:
    case 0xca:
switchD_0050197d_caseD_c5:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0xac5,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      instr = (Instr *)0x0;
      goto LAB_00501b5a;
    case 0xc6:
      func = this->m_func;
      opcode = InlineMathFloor;
      break;
    case 200:
      func = this->m_func;
      opcode = InlineMathExp;
      break;
    case 0xc9:
      func = this->m_func;
      opcode = InlineMathLog;
      break;
    case 0xcb:
      func = this->m_func;
      opcode = InlineMathSqrt;
      break;
    default:
      if (iVar4 == 0x105) {
        func = this->m_func;
        opcode = Trunc_A;
      }
      else {
        if (iVar4 != 0x107) goto switchD_0050197d_caseD_c5;
        func = this->m_func;
        opcode = Nearest_A;
      }
    }
  }
  instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,func);
LAB_00501b5a:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildDouble2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat64);
    srcOpnd->SetValueType(ValueType::Float);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
    dstOpnd->SetValueType(ValueType::Float);

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Ld_Db:
        instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Neg_Db:
        instr = IR::Instr::New(Js::OpCode::Neg_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Sin_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathSin, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Cos_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathCos, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Tan_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathTan, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Asin_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAsin, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Acos_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAcos, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Atan_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAtan, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Abs_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathAbs, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Ceil_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathCeil, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Floor_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathFloor, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Exp_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathExp, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Log_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathLog, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Sqrt_Db:
        instr = IR::Instr::New(Js::OpCode::InlineMathSqrt, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Return_Db:
        instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyFloat64);
        break;
    case Js::OpCodeAsmJs::Trunc_Db:
        instr = IR::Instr::New(Js::OpCode::Trunc_A, dstOpnd, srcOpnd, m_func);
        break;
    case Js::OpCodeAsmJs::Nearest_Db:
        instr = IR::Instr::New(Js::OpCode::Nearest_A, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}